

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastErS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined8 uVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  uint *puVar5;
  ParseContext *ctx_00;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ushort *puVar9;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar4 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  uVar1 = *(undefined8 *)
           ((long)&table->has_bits_offset +
           ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  uVar7 = (ulong)ptr[1];
  if ((long)uVar7 < 0) {
    ctx_00 = (ParseContext *)((long)ptr[2] << 7 | 0x7f);
    if ((long)ctx_00 < 0) {
      uVar8 = (long)ptr[3] << 0xe | 0x3fff;
      if ((long)uVar8 < 0) {
        ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[4] << 0x15 | 0x1fffffU));
        if ((long)ctx_00 < 0) {
          uVar8 = uVar8 & ((long)ptr[5] << 0x1c | 0xfffffffU);
          if ((long)uVar8 < 0) {
            ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[6] << 0x23 | 0x7ffffffffU));
            if ((long)ctx_00 < 0) {
              uVar8 = uVar8 & ((long)ptr[7] << 0x2a | 0x3ffffffffffU);
              if ((long)uVar8 < 0) {
                ctx_00 = (ParseContext *)((ulong)ctx_00 & ((long)ptr[8] << 0x31 | 0x1ffffffffffffU))
                ;
                if ((long)ctx_00 < 0) {
                  uVar8 = uVar8 & ((ulong)(byte)ptr[9] << 0x38 | 0xffffffffffffff);
                  if ((long)uVar8 < 0) {
                    puVar9 = (ushort *)(ptr + 0xb);
                    if ((ptr[10] != '\x01') && (ptr[10] < '\0')) {
                      pcVar4 = Error(msg,ptr,ctx_00,data,table,hasbits);
                      return pcVar4;
                    }
                  }
                  else {
                    puVar9 = (ushort *)(ptr + 10);
                  }
                }
                else {
                  puVar9 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar9 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar9 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar9 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar9 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar9 = (ushort *)(ptr + 4);
      }
      ctx_00 = (ParseContext *)((ulong)ctx_00 & uVar8);
    }
    else {
      puVar9 = (ushort *)(ptr + 3);
    }
    uVar7 = uVar7 & (ulong)ctx_00;
  }
  else {
    puVar9 = (ushort *)(ptr + 2);
  }
  iVar6 = (int)uVar7;
  if (((int)uVar1 <= iVar6) && (iVar6 <= (int)((ulong)uVar1 >> 0x20))) {
    uVar7 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
    piVar3 = RefAt<int>(msg,(ulong)data.field_0 >> 0x30);
    *piVar3 = iVar6;
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar9) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar5 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar5 = *puVar5 | (uint)uVar7;
      }
      return (char *)puVar9;
    }
    uVar2 = (uint)table->fast_idx_mask & (uint)*puVar9;
    if ((uVar2 & 7) == 0) {
      uVar8 = (ulong)(uVar2 & 0xfffffff8);
      pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + uVar8))
                                 (msg,puVar9,ctx,
                                  (ulong)*puVar9 ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2),
                                  table,uVar7);
      return pcVar4;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  pcVar4 = FastUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
  return pcVar4;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastErS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularEnum<uint8_t, field_layout::kTvRange>(
      PROTOBUF_TC_PARAM_PASS);
}